

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::CapturedStream::ReadEntireFile_abi_cxx11_
          (string *__return_storage_ptr__,CapturedStream *this,FILE *file)

{
  size_t sVar1;
  char *pcVar2;
  bool local_61;
  allocator local_3a;
  undefined1 local_39;
  char *local_38;
  size_t bytes_read;
  size_t bytes_last_read;
  char *buffer;
  size_t file_size;
  FILE *file_local;
  string *content;
  
  file_size = (size_t)this;
  file_local = (FILE *)__return_storage_ptr__;
  buffer = (char *)GetFileSize((FILE *)this);
  bytes_last_read = (size_t)operator_new__((ulong)buffer);
  bytes_read = 0;
  local_38 = (char *)0x0;
  fseek((FILE *)file_size,0,0);
  do {
    bytes_read = fread(local_38 + bytes_last_read,1,(long)buffer - (long)local_38,(FILE *)file_size)
    ;
    sVar1 = bytes_last_read;
    pcVar2 = local_38 + bytes_read;
    local_61 = bytes_read != 0 && pcVar2 < buffer;
    local_38 = pcVar2;
  } while (local_61);
  local_39 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)sVar1,(ulong)pcVar2,&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  if (bytes_last_read != 0) {
    operator_delete__((void *)bytes_last_read);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CapturedStream::ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  char* const buffer = new char[file_size];

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keeps reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read = fread(buffer+bytes_read, 1, file_size-bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  const std::string content(buffer, bytes_read);
  delete[] buffer;

  return content;
}